

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDiffReporter.cpp
# Opt level: O0

void __thiscall
ApprovalTests::GenericDiffReporter::GenericDiffReporter(GenericDiffReporter *this,string *program)

{
  CommandReporter *in_RSI;
  undefined8 *in_RDI;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  SystemLauncher *in_stack_ffffffffffffffd0;
  CommandLauncher *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__GenericDiffReporter_002a5f90;
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,(string *)in_RSI);
  CommandReporter::CommandReporter(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  *in_RDI = &PTR__GenericDiffReporter_002a5f90;
  SystemLauncher::SystemLauncher
            (in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf,
             (bool)in_stack_ffffffffffffffce);
  return;
}

Assistant:

GenericDiffReporter::GenericDiffReporter(const std::string& program)
        : CommandReporter(program, &launcher)
    {
    }